

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O2

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall
duckdb::ListTypeInfo::Deserialize(ListTypeInfo *this,Deserializer *deserializer)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ListTypeInfo *pLVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar3;
  shared_ptr<duckdb::ListTypeInfo,_true> result;
  
  pLVar2 = (ListTypeInfo *)operator_new(0x50);
  ListTypeInfo(pLVar2);
  ::std::__shared_ptr<duckdb::ListTypeInfo,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<duckdb::ListTypeInfo,void>
            ((__shared_ptr<duckdb::ListTypeInfo,(__gnu_cxx::_Lock_policy)2> *)&result,pLVar2);
  pLVar2 = shared_ptr<duckdb::ListTypeInfo,_true>::operator->(&result);
  Deserializer::ReadProperty<duckdb::LogicalType>(deserializer,200,"child_type",&pLVar2->child_type)
  ;
  _Var1 = result.internal.super___shared_ptr<duckdb::ListTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  result.internal.super___shared_ptr<duckdb::ListTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ExtraTypeInfo)._vptr_ExtraTypeInfo =
       (_func_int **)
       result.internal.super___shared_ptr<duckdb::ListTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_ExtraTypeInfo).type = _Var1._M_pi;
  result.internal.super___shared_ptr<duckdb::ListTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &result.internal.super___shared_ptr<duckdb::ListTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ExtraTypeInfo;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> ListTypeInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::shared_ptr<ListTypeInfo>(new ListTypeInfo());
	deserializer.ReadProperty<LogicalType>(200, "child_type", result->child_type);
	return std::move(result);
}